

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_static_await(klass cls,method m,void **args,size_t size,
                        class_resolve_callback resolve_callback,
                        class_reject_callback reject_callback,void *context)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  method_conflict in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  value v;
  value local_8;
  
  if ((((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x20) == 0)) ||
     (in_RSI == (method_conflict)0x0)) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = (value)(**(code **)(in_RDI[3] + 0x28))(in_RDI,in_RDI[2],in_RSI,in_RDX,in_RCX,in_R8);
    if (local_8 == (value)0x0) {
      uVar1 = *in_RDI;
      pcVar2 = method_name(in_RSI);
      log_write_impl_va("metacall",0x30e,"class_static_await",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s await of method %s",uVar1,pcVar2);
      local_8 = (value)0x0;
    }
  }
  return local_8;
}

Assistant:

value class_static_await(klass cls, method m, class_args args, size_t size, class_resolve_callback resolve_callback, class_reject_callback reject_callback, void *context)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_invoke != NULL && m != NULL)
	{
		value v = cls->interface->static_await(cls, cls->impl, m, args, size, resolve_callback, reject_callback, context);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s await of method %s", cls->name, method_name(m));

			return NULL;
		}

		return v;
	}

	return NULL;
}